

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::ATan2,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  double *rdata_00;
  ValidityMask *result_data_00;
  idx_t in_RCX;
  byte in_R8B;
  double *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffed8;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffee0;
  SelectionVector *rsel;
  double *ldata_00;
  ValidityMask *in_stack_ffffffffffffff30;
  SelectionVector *in_stack_ffffffffffffff38;
  SelectionVector *rvalidity;
  ValidityMask *in_stack_ffffffffffffff40;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  SelectionVector local_70 [2];
  byte local_31;
  idx_t local_30;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::SetVectorType(in_stack_fffffffffffffee0,vector_type_p);
  rdata_00 = FlatVector::GetData<double>((Vector *)0x20ca9ed);
  ldata_00 = rdata_00;
  UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  rsel = local_70;
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff48;
  rvalidity = in_stack_ffffffffffffff38;
  result_data_00 = FlatVector::Validity((Vector *)0x20caa7a);
  ExecuteGenericLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::ATan2,bool>
            (ldata_00,rdata_00,(double *)result_data_00,(SelectionVector *)this,rsel,local_30,
             in_stack_ffffffffffffff30,(ValidityMask *)rvalidity,in_stack_ffffffffffffff40,
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}